

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  Atom atom;
  unsigned_long i;
  char *atomName_local;
  unsigned_long atomCount_local;
  Atom *supportedAtoms_local;
  
  AVar1 = XInternAtom(_glfw.x11.display,atomName,0);
  atom = 0;
  while( true ) {
    if (atomCount <= atom) {
      return 0;
    }
    if (supportedAtoms[atom] == AVar1) break;
    atom = atom + 1;
  }
  return AVar1;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    unsigned long i;
    const Atom atom = XInternAtom(_glfw.x11.display, atomName, False);

    for (i = 0;  i < atomCount;  i++)
    {
        if (supportedAtoms[i] == atom)
            return atom;
    }

    return None;
}